

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_val_error(gs_val_t *__return_storage_ptr__,char *v,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  gs_val_t *val;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  va_list args;
  char *v_local;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_d8;
  args[0]._0_8_ = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  args[0].reg_save_area = v;
  vsnprintf(gs_val_error::error_string,0x800,v,&local_28);
  __return_storage_ptr__->type = GS_VAL_ERROR;
  __return_storage_ptr__->is_return = true;
  (__return_storage_ptr__->field_2).list_val = (vec_gs_val_t *)gs_val_error::error_string;
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_val_error(const char *v, ...) {
    static char error_string[2048]; 

    va_list args;
    va_start(args, v);
    vsnprintf(error_string, 2048, v, args);
    va_end(args);

    gs_val_t val;
    val.type = GS_VAL_ERROR;
    val.is_return = true;
    val.error_val = error_string;
    return val;
}